

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool mkvparser::PrimaryChromaticity::Parse
               (IMkvReader *reader,longlong read_pos,longlong value_size,bool is_x,
               PrimaryChromaticity **chromaticity)

{
  PrimaryChromaticity *pPVar1;
  long lVar2;
  double parser_value;
  double local_38;
  
  if (reader == (IMkvReader *)0x0) {
    return false;
  }
  pPVar1 = *chromaticity;
  if (pPVar1 == (PrimaryChromaticity *)0x0) {
    pPVar1 = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
    if (pPVar1 == (PrimaryChromaticity *)0x0) {
      *chromaticity = (PrimaryChromaticity *)0x0;
      return false;
    }
    pPVar1->x = 0.0;
    pPVar1->y = 0.0;
    *chromaticity = pPVar1;
  }
  local_38 = 0.0;
  lVar2 = UnserializeFloat(reader,read_pos,value_size,&local_38);
  if (lVar2 < 0) {
    return false;
  }
  if (local_38 < 0.0) {
    return false;
  }
  if (local_38 <= 1.0) {
    if ((0.0 < local_38) && (local_38 < 1.1754943508222875e-38)) {
      return false;
    }
    (&pPVar1->x)[!is_x] = (float)local_38;
    return true;
  }
  return false;
}

Assistant:

bool PrimaryChromaticity::Parse(IMkvReader* reader, long long read_pos,
                                long long value_size, bool is_x,
                                PrimaryChromaticity** chromaticity) {
  if (!reader)
    return false;

  if (!*chromaticity)
    *chromaticity = new (std::nothrow) PrimaryChromaticity();

  if (!*chromaticity)
    return false;

  PrimaryChromaticity* pc = *chromaticity;
  float* value = is_x ? &pc->x : &pc->y;

  double parser_value = 0;
  const long long parse_status =
      UnserializeFloat(reader, read_pos, value_size, parser_value);

  // Valid range is [0, 1]. Make sure the double is representable as a float
  // before casting.
  if (parse_status < 0 || parser_value < 0.0 || parser_value > 1.0 ||
      (parser_value > 0.0 && parser_value < FLT_MIN))
    return false;

  *value = static_cast<float>(parser_value);

  return true;
}